

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollArea::AbstractScrollArea
          (AbstractScrollArea *this,AbstractScrollAreaPrivate *dd,QWidget *parent)

{
  QTimer *pQVar1;
  Scroller *pSVar2;
  QVariantAnimation *pQVar3;
  undefined4 *puVar4;
  code *local_98;
  ImplFn local_90;
  code *local_88;
  undefined8 local_80;
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QFrame::QFrame(&this->super_QFrame,parent,0);
  *(undefined ***)this = &PTR_metaObject_00197f68;
  *(undefined ***)&this->field_0x10 = &PTR__AbstractScrollArea_00198130;
  (this->d).d = dd;
  AbstractScrollAreaPrivate::init(dd,(EVP_PKEY_CTX *)parent);
  pQVar1 = ((this->d).d)->animationTimer;
  local_88 = QTimer::timeout;
  local_80 = 0;
  local_98 = _q_animateScrollIndicators;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar4 + 4) = _q_animateScrollIndicators;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pQVar1,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pQVar1 = ((this->d).d)->startBlurAnimTimer;
  local_88 = QTimer::timeout;
  local_80 = 0;
  local_98 = _q_startBlurAnim;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar4 + 4) = _q_startBlurAnim;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar1,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pSVar2 = ((this->d).d)->scroller;
  local_88 = Scroller::scroll;
  local_80 = 0;
  local_98 = _q_kineticScrolling;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = _q_kineticScrolling;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pSVar2,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pSVar2 = ((this->d).d)->scroller;
  local_88 = Scroller::aboutToStart;
  local_80 = 0;
  local_98 = _q_kineticScrollingAboutToStart;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar4 + 4) = _q_kineticScrollingAboutToStart;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pSVar2,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pSVar2 = ((this->d).d)->scroller;
  local_88 = Scroller::finished;
  local_80 = 0;
  local_98 = _q_kineticScrollingFinished;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar4 + 4) = _q_kineticScrollingFinished;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pSVar2,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pQVar3 = ((this->d).d)->horBlurAnim;
  local_88 = QVariantAnimation::valueChanged;
  local_80 = 0;
  local_98 = _q_horBlurAnim;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(const_QVariant_&),_QtPrivate::List<const_QVariant_&>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = _q_horBlurAnim;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar3,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pQVar3 = ((this->d).d)->horBlurAnim;
  local_88 = QAbstractAnimation::finished;
  local_80 = 0;
  local_98 = _q_horBlurAnimFinished;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar4 + 4) = _q_horBlurAnimFinished;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar3,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar3 = ((this->d).d)->vertBlurAnim;
  local_88 = QVariantAnimation::valueChanged;
  local_80 = 0;
  local_98 = _q_vertBlurAnim;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(const_QVariant_&),_QtPrivate::List<const_QVariant_&>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = _q_vertBlurAnim;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)pQVar3,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  pQVar3 = ((this->d).d)->vertBlurAnim;
  local_88 = QAbstractAnimation::finished;
  local_80 = 0;
  local_98 = _q_vertBlurAnimFinished;
  local_90 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::AbstractScrollArea::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar4 + 4) = _q_vertBlurAnimFinished;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)pQVar3,(QObject *)&local_88,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  return;
}

Assistant:

AbstractScrollArea::AbstractScrollArea( AbstractScrollAreaPrivate * dd,
	QWidget * parent )
	:	QFrame( parent )
	,	d( dd )
{
	d->init();

	connect( d->animationTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_animateScrollIndicators );

	connect( d->startBlurAnimTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_startBlurAnim );

	connect( d->scroller, &Scroller::scroll,
		this, &AbstractScrollArea::_q_kineticScrolling );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &AbstractScrollArea::_q_kineticScrollingAboutToStart );

	connect( d->scroller, &Scroller::finished,
		this, &AbstractScrollArea::_q_kineticScrollingFinished );

	connect( d->horBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_horBlurAnim );

	connect( d->horBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_horBlurAnimFinished );

	connect( d->vertBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_vertBlurAnim );

	connect( d->vertBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_vertBlurAnimFinished );
}